

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration.h
# Opt level: O0

bool __thiscall spvtools::val::Decoration::operator<(Decoration *this,Decoration *rhs)

{
  Decoration *rhs_local;
  Decoration *this_local;
  
  if (this->struct_member_index_ < rhs->struct_member_index_) {
    this_local._7_1_ = true;
  }
  else if (rhs->struct_member_index_ < this->struct_member_index_) {
    this_local._7_1_ = false;
  }
  else if (this->dec_type_ < rhs->dec_type_) {
    this_local._7_1_ = true;
  }
  else if (rhs->dec_type_ < this->dec_type_) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = std::operator<(&this->params_,&rhs->params_);
  }
  return this_local._7_1_;
}

Assistant:

inline bool operator<(const Decoration& rhs) const {
    // Note: Sort by struct_member_index_ first, then type, so look up can be
    // efficient using lower_bound() and upper_bound().
    if (struct_member_index_ < rhs.struct_member_index_) return true;
    if (rhs.struct_member_index_ < struct_member_index_) return false;
    if (dec_type_ < rhs.dec_type_) return true;
    if (rhs.dec_type_ < dec_type_) return false;
    return params_ < rhs.params_;
  }